

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TVariable * __thiscall
glslang::TParseContext::declareNonArray
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TType *type)

{
  TSymbolTable *pTVar1;
  bool bVar2;
  int iVar3;
  TVariable *this_00;
  undefined4 extraout_var;
  
  this_00 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)loc);
  TVariable::TVariable(this_00,identifier,type,false);
  ioArrayCheck(this,loc,type,identifier);
  bVar2 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_00);
  if (bVar2) {
    pTVar1 = (this->super_TParseContextBase).symbolTable;
    if ((int)((ulong)((long)(pTVar1->table).
                            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pTVar1->table).
                           super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) < 5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,this_00);
    }
  }
  else {
    iVar3 = (*(this_00->super_TSymbol)._vptr_TSymbol[3])(this_00);
    this_00 = (TVariable *)0x0;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"redefinition",*(undefined8 *)(CONCAT44(extraout_var,iVar3) + 8),"");
  }
  return this_00;
}

Assistant:

TVariable* TParseContext::declareNonArray(const TSourceLoc& loc, const TString& identifier, const TType& type)
{
    // make a new variable
    TVariable* variable = new TVariable(&identifier, type);

    ioArrayCheck(loc, type, identifier);

    // add variable to symbol table
    if (symbolTable.insert(*variable)) {
        if (symbolTable.atGlobalLevel())
            trackLinkage(*variable);
        return variable;
    }

    error(loc, "redefinition", variable->getName().c_str(), "");
    return nullptr;
}